

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.h
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::~SemanticModelTester(SemanticModelTester *this)

{
  SemanticModelTester *this_local;
  
  ~SemanticModelTester(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

SemanticModelTester(TestSuite* suite) : Tester(suite) {}